

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O2

bool __thiscall
tinyusdz::GeomPrimvar::get_value<std::array<int,2ul>>
          (GeomPrimvar *this,array<int,_2UL> *dest,string *err)

{
  Attribute *this_00;
  bool bVar1;
  uint32_t tyid;
  value_type *pvVar2;
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  *this_01;
  const_reference pvVar3;
  array<int,_2UL> *paVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  optional<std::array<int,_2UL>_> pv;
  allocator local_a1;
  undefined1 local_a0 [4];
  optional<std::array<int,_2UL>_> local_9c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90 [2];
  string local_70;
  string local_50 [32];
  
  if (dest != (array<int,_2UL> *)0x0) {
    this_00 = &this->_attr;
    bVar1 = Attribute::is_blocked(this_00);
    if (!bVar1) {
      bVar1 = primvar::PrimVar::has_value(&(this->_attr)._var);
      if (!bVar1) {
        if (*(pointer *)
             ((long)&(this->_attr)._var._ts._samples.
                     super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                     ._M_impl.super__Vector_impl_data + 8) ==
            (this->_attr)._var._ts._samples.
            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          return (bool)'\0';
        }
        this_01 = tinyusdz::value::TimeSamples::get_samples(&(this->_attr)._var._ts);
        pvVar3 = std::
                 vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                 ::at(this_01,0);
        paVar4 = tinyusdz::value::Value::as<std::array<int,2ul>>(&pvVar3->value,false);
        if (paVar4 != (array<int,_2UL> *)0x0) {
          *(undefined8 *)dest->_M_elems = *(undefined8 *)paVar4->_M_elems;
          return (bool)'\x01';
        }
        return (bool)'\0';
      }
      tyid = Attribute::type_id(this_00);
      bVar1 = IsSupportedGeomPrimvarType(tyid);
      if (!bVar1) {
        if (err == (string *)0x0) {
          return (bool)'\0';
        }
        std::__cxx11::string::string
                  (local_50,"Unsupported type for GeomPrimvar. type = `{}`",(allocator *)&local_9c);
        Attribute::type_name_abi_cxx11_(&local_70,this_00);
        fmt::format<std::__cxx11::string>((string *)local_90,(fmt *)local_50,&local_70,in_RCX);
        std::__cxx11::string::append((string *)err);
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        return (bool)'\0';
      }
      Attribute::get_value<std::array<int,2ul>>((optional<std::array<int,_2UL>_> *)local_90,this_00)
      ;
      local_9c.has_value_ = (bool)local_90[0]._0_1_;
      if (local_90[0]._M_local_buf[0] == '\x01') {
        local_9c.contained = (storage_t<std::array<int,_2UL>_>)local_90[0]._4_8_;
        pvVar2 = nonstd::optional_lite::optional<std::array<int,_2UL>_>::value(&local_9c);
        *(undefined8 *)dest->_M_elems = *(undefined8 *)pvVar2->_M_elems;
        return (bool)'\x01';
      }
      if (err != (string *)0x0) {
        std::__cxx11::string::string
                  (local_50,
                   "Attribute value type mismatch. Requested type `{}` but Attribute has type `{}`",
                   &local_a1);
        local_a0 = (undefined1  [4])0x14;
        Attribute::type_name_abi_cxx11_(&local_70,this_00);
        fmt::format<unsigned_int,std::__cxx11::string>
                  ((string *)local_90,(fmt *)local_50,(string *)local_a0,(uint *)&local_70,in_R8);
        std::__cxx11::string::append((string *)err);
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        return (bool)local_90[0]._0_1_;
      }
      return (bool)local_90[0]._0_1_;
    }
  }
  if (err != (string *)0x0) {
    std::__cxx11::string::append((char *)err);
  }
  return false;
}

Assistant:

bool GeomPrimvar::get_value(T *dest, std::string *err) const {
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<value::token>::type_id(), "`token` type is not supported as a GeomPrimvar");
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<std::vector<value::token>>::type_id(), "`token[]` type is not supported as a GeomPrimvar");

  if (!dest) {
    if (err) {
      (*err) += "Output value is nullptr.";
    }
    return false;
  }

  if (_attr.is_blocked()) {
    if (err) {
      (*err) += "Attribute is blocked.";
    }
    return false;
  }

  if (_attr.has_value()) {
    if (!IsSupportedGeomPrimvarType(_attr.type_id())) {
      if (err) {
        (*err) += fmt::format("Unsupported type for GeomPrimvar. type = `{}`",
                              _attr.type_name());
      }
      return false;
    }

    if (auto pv = _attr.get_value<T>()) {

      // copy
      (*dest) = pv.value();
      return true;

    } else {
      if (err) {
        (*err) += fmt::format("Attribute value type mismatch. Requested type `{}` but Attribute has type `{}`", value::TypeTraits<T>::type_id(), _attr.type_name());
      }
      return false;
    }
  }

  if (_attr.has_timesamples()) {
    // Return the first sample.
    const auto &ts = _attr.get_var().ts_raw();
    if (ts.empty()) {
      if (err) {
        (*err) += "No TimeSample value in Attribute..";
      }
      return false;
    }
    
    if (auto pv =ts.get_samples().at(0).value.as<T>()) {
      (*dest) = (*pv);
      return true;
    }
  }

  return false;
}